

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

sat_solver * zsat_solver_new_seed(double seed)

{
  int iVar1;
  sat_solver *s_00;
  clause *pcVar2;
  sat_solver *s;
  double seed_local;
  
  s_00 = (sat_solver *)calloc(0x2d8,1);
  Sat_MemAlloc_(&s_00->Mem,0xf);
  s_00->hLearnts = -1;
  iVar1 = Sat_MemAppend(&s_00->Mem,(int *)0x0,2,0,0);
  s_00->hBinary = iVar1;
  pcVar2 = clause_read(s_00,s_00->hBinary);
  s_00->binary = pcVar2;
  s_00->nLearntStart = 10000;
  s_00->nLearntDelta = 1000;
  s_00->nLearntRatio = 0x32;
  s_00->nLearntMax = s_00->nLearntStart;
  veci_new(&s_00->order);
  veci_new(&s_00->trail_lim);
  veci_new(&s_00->tagged);
  veci_new(&s_00->act_clas);
  veci_new(&s_00->stack);
  veci_new(&s_00->unit_lits);
  veci_new(&s_00->temp_clause);
  veci_new(&s_00->conf_final);
  s_00->wlists = (veci *)0x0;
  s_00->activity = (word *)0x0;
  s_00->orderpos = (int *)0x0;
  s_00->reasons = (int *)0x0;
  s_00->trail = (lit *)0x0;
  s_00->size = 0;
  s_00->cap = 0;
  s_00->qhead = 0;
  s_00->qtail = 0;
  solver_init_activities(s_00);
  veci_new(&s_00->act_vars);
  s_00->root_level = 0;
  s_00->random_seed = seed;
  s_00->progress_estimate = 0.0;
  s_00->verbosity = 0;
  (s_00->stats).starts = 0;
  (s_00->stats).decisions = 0;
  (s_00->stats).propagations = 0;
  (s_00->stats).inspects = 0;
  (s_00->stats).conflicts = 0;
  (s_00->stats).clauses = 0;
  (s_00->stats).clauses_literals = 0;
  (s_00->stats).learnts = 0;
  (s_00->stats).learnts_literals = 0;
  (s_00->stats).tot_literals = 0;
  return s_00;
}

Assistant:

sat_solver* zsat_solver_new_seed(double seed)
{
    sat_solver* s = (sat_solver*)ABC_CALLOC( char, sizeof(sat_solver));

//    Vec_SetAlloc_(&s->Mem, 15);
    Sat_MemAlloc_(&s->Mem, 15);
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    s->nLearntStart = LEARNT_MAX_START_DEFAULT;  // starting learned clause limit
    s->nLearntDelta = LEARNT_MAX_INCRE_DEFAULT;  // delta of learned clause limit
    s->nLearntRatio = LEARNT_MAX_RATIO_DEFAULT;  // ratio of learned clause limit
    s->nLearntMax   = s->nLearntStart;

    // initialize vectors
    veci_new(&s->order);
    veci_new(&s->trail_lim);
    veci_new(&s->tagged);
//    veci_new(&s->learned);
    veci_new(&s->act_clas);
    veci_new(&s->stack);
//    veci_new(&s->model);
    veci_new(&s->unit_lits);
    veci_new(&s->temp_clause);
    veci_new(&s->conf_final);

    // initialize arrays
    s->wlists    = 0;
    s->activity  = 0;
    s->orderpos  = 0;
    s->reasons   = 0;
    s->trail     = 0;

    // initialize other vars
    s->size                   = 0;
    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_new(&s->act_vars);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = seed;
    s->progress_estimate      = 0;
//    s->binary                 = (clause*)ABC_ALLOC( char, sizeof(clause) + sizeof(lit)*2);
//    s->binary->size_learnt    = (2 << 1);
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
    return s;
}